

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O2

t_int * over_perf8(t_int *w)

{
  uint *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  long lVar6;
  t_int tVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  lVar4 = w[1];
  lVar5 = w[2];
  lVar6 = w[3];
  tVar7 = w[4];
  for (lVar8 = 0; (int)tVar7 != (int)lVar8; lVar8 = lVar8 + 8) {
    auVar10 = *(undefined1 (*) [16])(lVar5 + lVar8 * 4);
    auVar2 = *(undefined1 (*) [16])(lVar5 + 0x10 + lVar8 * 4);
    auVar3 = *(undefined1 (*) [16])(lVar4 + 0x10 + lVar8 * 4);
    auVar9 = divps(*(undefined1 (*) [16])(lVar4 + lVar8 * 4),auVar10);
    puVar1 = (uint *)(lVar6 + lVar8 * 4);
    *puVar1 = -(uint)(auVar10._0_4_ != 0.0) & auVar9._0_4_;
    puVar1[1] = -(uint)(auVar10._4_4_ != 0.0) & auVar9._4_4_;
    puVar1[2] = -(uint)(auVar10._8_4_ != 0.0) & auVar9._8_4_;
    puVar1[3] = -(uint)(auVar10._12_4_ != 0.0) & auVar9._12_4_;
    auVar10 = divps(auVar3,auVar2);
    puVar1 = (uint *)(lVar6 + 0x10 + lVar8 * 4);
    *puVar1 = -(uint)(auVar2._0_4_ != 0.0) & auVar10._0_4_;
    puVar1[1] = -(uint)(auVar2._4_4_ != 0.0) & auVar10._4_4_;
    puVar1[2] = -(uint)(auVar2._8_4_ != 0.0) & auVar10._8_4_;
    puVar1[3] = -(uint)(auVar2._12_4_ != 0.0) & auVar10._12_4_;
  }
  return w + 5;
}

Assistant:

t_int *over_perf8(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    for (; n; n -= 8, in1 += 8, in2 += 8, out += 8)
    {
        t_sample f0 = in1[0], f1 = in1[1], f2 = in1[2], f3 = in1[3];
        t_sample f4 = in1[4], f5 = in1[5], f6 = in1[6], f7 = in1[7];

        t_sample g0 = in2[0], g1 = in2[1], g2 = in2[2], g3 = in2[3];
        t_sample g4 = in2[4], g5 = in2[5], g6 = in2[6], g7 = in2[7];

        out[0] = (g0? f0 / g0 : 0);
        out[1] = (g1? f1 / g1 : 0);
        out[2] = (g2? f2 / g2 : 0);
        out[3] = (g3? f3 / g3 : 0);
        out[4] = (g4? f4 / g4 : 0);
        out[5] = (g5? f5 / g5 : 0);
        out[6] = (g6? f6 / g6 : 0);
        out[7] = (g7? f7 / g7 : 0);
    }
    return (w+5);
}